

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FASTCOVER_buildDictionary
                 (FASTCOVER_ctx_t *ctx,U32 *freqs,void *dictBuffer,size_t dictBufferCapacity,
                 ZDICT_cover_params_t parameters,U16 *segmentFreqs)

{
  short *psVar1;
  short sVar2;
  U32 f;
  COVER_epoch_info_t CVar3;
  size_t sVar4;
  clock_t cVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint in_R9D;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  uint local_bc;
  size_t local_a8;
  
  CVar3 = COVER_computeEpochs((U32)dictBufferCapacity,(U32)ctx->nbDmers,(U32)segmentFreqs,1);
  if (1 < g_displayLevel) {
    FASTCOVER_buildDictionary_cold_1();
  }
  if (dictBufferCapacity == 0) {
    local_a8 = 0;
    sVar4 = local_a8;
  }
  else {
    local_a8 = 0;
    uVar10 = 0;
    uVar6 = 0;
    do {
      uVar9 = uVar6 * ((ulong)CVar3 >> 0x20);
      uVar12 = (uint)uVar9;
      uVar14 = uVar12 + CVar3.size;
      f = ctx->f;
      bVar16 = true;
      if (uVar12 < uVar14) {
        uVar11 = uVar9 & 0xffffffff;
        uVar13 = 0;
        uVar8 = 0;
        uVar7 = 0;
        local_bc = 0;
        do {
          uVar12 = uVar12 + 1;
          sVar4 = FASTCOVER_hashPtrToIndex(ctx->samples + uVar11,f,in_R9D);
          sVar2 = *(short *)(parameters._0_8_ + sVar4 * 2);
          if (sVar2 == 0) {
            local_bc = local_bc + freqs[sVar4];
          }
          *(short *)(parameters._0_8_ + sVar4 * 2) = sVar2 + 1;
          if (((in_R9D - (U32)segmentFreqs) + uVar12) - (int)uVar9 == 2) {
            sVar4 = FASTCOVER_hashPtrToIndex(ctx->samples + (uVar9 & 0xffffffff),f,in_R9D);
            psVar1 = (short *)(parameters._0_8_ + sVar4 * 2);
            *psVar1 = *psVar1 + -1;
            if (*psVar1 == 0) {
              local_bc = local_bc - freqs[sVar4];
            }
            uVar9 = (ulong)((int)uVar9 + 1);
          }
          uVar11 = uVar11 + 1;
          if (uVar7 < local_bc) {
            uVar13 = uVar9 & 0xffffffff;
            uVar7 = local_bc;
            uVar8 = uVar12;
          }
        } while (uVar14 != uVar11);
        local_bc = (uint)uVar13;
        bVar16 = uVar7 == 0;
      }
      else {
        uVar8 = 0;
        local_bc = 0;
      }
      uVar12 = local_bc;
      if ((uint)uVar9 < uVar14) {
        uVar13 = uVar9 & 0xffffffff;
        iVar15 = uVar14 - (uint)uVar9;
        do {
          sVar4 = FASTCOVER_hashPtrToIndex(ctx->samples + uVar13,f,in_R9D);
          psVar1 = (short *)(parameters._0_8_ + sVar4 * 2);
          *psVar1 = *psVar1 + -1;
          uVar13 = uVar13 + 1;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      for (; uVar12 != uVar8; uVar12 = uVar12 + 1) {
        sVar4 = FASTCOVER_hashPtrToIndex(ctx->samples + uVar12,f,in_R9D);
        freqs[sVar4] = 0;
      }
      if (bVar16) {
        sVar4 = dictBufferCapacity;
        if (8 < uVar10) break;
        uVar10 = uVar10 + 1;
      }
      else {
        uVar10 = (ulong)((uVar8 + (in_R9D - 1)) - local_bc);
        if (dictBufferCapacity < uVar10) {
          uVar10 = dictBufferCapacity;
        }
        sVar4 = dictBufferCapacity;
        if (uVar10 < in_R9D) break;
        dictBufferCapacity = dictBufferCapacity - uVar10;
        memcpy((void *)((long)dictBuffer + dictBufferCapacity),ctx->samples + local_bc,uVar10);
        if ((1 < g_displayLevel) &&
           ((cVar5 = clock(), 150000 < cVar5 - g_time || (3 < g_displayLevel)))) {
          FASTCOVER_buildDictionary_cold_2();
        }
        uVar10 = 0;
      }
      uVar6 = (uVar6 + 1) % ((ulong)CVar3 & 0xffffffff);
      sVar4 = local_a8;
    } while (dictBufferCapacity != 0);
  }
  local_a8 = sVar4;
  if (1 < g_displayLevel) {
    FASTCOVER_buildDictionary_cold_3();
  }
  return local_a8;
}

Assistant:

static size_t
FASTCOVER_buildDictionary(const FASTCOVER_ctx_t* ctx,
                          U32* freqs,
                          void* dictBuffer, size_t dictBufferCapacity,
                          ZDICT_cover_params_t parameters,
                          U16* segmentFreqs)
{
  BYTE *const dict = (BYTE *)dictBuffer;
  size_t tail = dictBufferCapacity;
  /* Divide the data into epochs. We will select one segment from each epoch. */
  const COVER_epoch_info_t epochs = COVER_computeEpochs(
      (U32)dictBufferCapacity, (U32)ctx->nbDmers, parameters.k, 1);
  const size_t maxZeroScoreRun = 10;
  size_t zeroScoreRun = 0;
  size_t epoch;
  DISPLAYLEVEL(2, "Breaking content into %u epochs of size %u\n",
                (U32)epochs.num, (U32)epochs.size);
  /* Loop through the epochs until there are no more segments or the dictionary
   * is full.
   */
  for (epoch = 0; tail > 0; epoch = (epoch + 1) % epochs.num) {
    const U32 epochBegin = (U32)(epoch * epochs.size);
    const U32 epochEnd = epochBegin + epochs.size;
    size_t segmentSize;
    /* Select a segment */
    COVER_segment_t segment = FASTCOVER_selectSegment(
        ctx, freqs, epochBegin, epochEnd, parameters, segmentFreqs);

    /* If the segment covers no dmers, then we are out of content.
     * There may be new content in other epochs, for continue for some time.
     */
    if (segment.score == 0) {
      if (++zeroScoreRun >= maxZeroScoreRun) {
          break;
      }
      continue;
    }
    zeroScoreRun = 0;

    /* Trim the segment if necessary and if it is too small then we are done */
    segmentSize = MIN(segment.end - segment.begin + parameters.d - 1, tail);
    if (segmentSize < parameters.d) {
      break;
    }

    /* We fill the dictionary from the back to allow the best segments to be
     * referenced with the smallest offsets.
     */
    tail -= segmentSize;
    memcpy(dict + tail, ctx->samples + segment.begin, segmentSize);
    DISPLAYUPDATE(
        2, "\r%u%%       ",
        (unsigned)(((dictBufferCapacity - tail) * 100) / dictBufferCapacity));
  }
  DISPLAYLEVEL(2, "\r%79s\r", "");
  return tail;
}